

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-util.c
# Opt level: O0

void dump_level_body(ang_file *fo,char *title,chunk_conflict *c,int **dist)

{
  _Bool _Var1;
  loc_conflict grid_00;
  object *poVar2;
  bool bVar3;
  char *local_40;
  char *s;
  loc grid;
  wchar_t x;
  wchar_t y;
  int **dist_local;
  chunk_conflict *c_local;
  char *title_local;
  ang_file *fo_local;
  
  file_put(fo,"    <p>");
  dump_level_escaped_string(fo,title);
  if (dist != (int **)0x0) {
    file_put(fo,"\n    <p>A location where the distance array was negative is marked with *.");
  }
  file_put(fo,"\n    <pre>\n");
  for (grid.y = 0; grid.y < c->height; grid.y = grid.y + 1) {
    for (grid.x = 0; grid.x < c->width; grid.x = grid.x + 1) {
      grid_00 = (loc_conflict)loc(grid.x,grid.y);
      local_40 = "#";
      _Var1 = square_in_bounds_fully((chunk *)c,grid_00);
      if (_Var1) {
        _Var1 = square_isplayer((chunk *)c,grid_00);
        if (_Var1) {
          local_40 = "@";
        }
        else {
          _Var1 = square_isoccupied((chunk *)c,grid_00);
          if (_Var1) {
            bVar3 = true;
            if (dist != (int **)0x0) {
              bVar3 = -1 < dist[grid.y][grid.x];
            }
            local_40 = "*";
            if (bVar3) {
              local_40 = "M";
            }
          }
          else {
            _Var1 = square_isdoor((chunk *)c,grid_00);
            if (_Var1) {
              bVar3 = true;
              if (dist != (int **)0x0) {
                bVar3 = -1 < dist[grid.y][grid.x];
              }
              local_40 = "*";
              if (bVar3) {
                local_40 = "+";
              }
            }
            else {
              _Var1 = square_isrubble((chunk *)c,grid_00);
              if (_Var1) {
                bVar3 = true;
                if (dist != (int **)0x0) {
                  bVar3 = -1 < dist[grid.y][grid.x];
                }
                local_40 = "*";
                if (bVar3) {
                  local_40 = ":";
                }
              }
              else {
                _Var1 = square_isdownstairs((chunk *)c,grid_00);
                if (_Var1) {
                  bVar3 = true;
                  if (dist != (int **)0x0) {
                    bVar3 = -1 < dist[grid.y][grid.x];
                  }
                  local_40 = "*";
                  if (bVar3) {
                    local_40 = "&gt;";
                  }
                }
                else {
                  _Var1 = square_isupstairs((chunk *)c,grid_00);
                  if (_Var1) {
                    bVar3 = true;
                    if (dist != (int **)0x0) {
                      bVar3 = -1 < dist[grid.y][grid.x];
                    }
                    local_40 = "*";
                    if (bVar3) {
                      local_40 = "&lt;";
                    }
                  }
                  else {
                    _Var1 = square_istrap((chunk *)c,grid_00);
                    if ((_Var1) || (_Var1 = square_isplayertrap((chunk *)c,grid_00), _Var1)) {
                      bVar3 = true;
                      if (dist != (int **)0x0) {
                        bVar3 = -1 < dist[grid.y][grid.x];
                      }
                      local_40 = "*";
                      if (bVar3) {
                        local_40 = "^";
                      }
                    }
                    else {
                      _Var1 = square_iswebbed((chunk *)c,grid_00);
                      if (_Var1) {
                        bVar3 = true;
                        if (dist != (int **)0x0) {
                          bVar3 = -1 < dist[grid.y][grid.x];
                        }
                        local_40 = "*";
                        if (bVar3) {
                          local_40 = "w";
                        }
                      }
                      else {
                        poVar2 = square_object((chunk *)c,grid_00);
                        if (poVar2 == (object *)0x0) {
                          _Var1 = square_isempty((chunk *)c,grid_00);
                          if ((_Var1) &&
                             ((_Var1 = square_isvault((chunk *)c,grid_00), _Var1 ||
                              (_Var1 = square_isno_stairs((chunk *)c,grid_00), _Var1)))) {
                            bVar3 = true;
                            if (dist != (int **)0x0) {
                              bVar3 = -1 < dist[grid.y][grid.x];
                            }
                            local_40 = "*";
                            if (bVar3) {
                              local_40 = " ";
                            }
                          }
                          else {
                            _Var1 = square_ispassable((chunk *)c,grid_00);
                            if (_Var1) {
                              bVar3 = true;
                              if (dist != (int **)0x0) {
                                bVar3 = -1 < dist[grid.y][grid.x];
                              }
                              local_40 = "*";
                              if (bVar3) {
                                local_40 = ".";
                              }
                            }
                          }
                        }
                        else {
                          bVar3 = true;
                          if (dist != (int **)0x0) {
                            bVar3 = -1 < dist[grid.y][grid.x];
                          }
                          local_40 = "*";
                          if (bVar3) {
                            local_40 = "$";
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      file_put(fo,local_40);
    }
    file_put(fo,"\n");
  }
  file_put(fo,"    </pre>\n");
  return;
}

Assistant:

void dump_level_body(ang_file *fo, const char *title, struct chunk *c,
	int **dist)
{
	int y;

	file_put(fo, "    <p>");
	dump_level_escaped_string(fo, title);
	if (dist != NULL) {
		file_put(fo, "\n    <p>A location where the distance array was negative is marked with *.");
	}
	file_put(fo, "\n    <pre>\n");
	for (y = 0; y < c->height; ++y) {
		int x;

		for (x = 0; x < c->width; ++x) {
			struct loc grid = loc(x, y);
			const char *s = "#";

			if (square_in_bounds_fully(c, grid)) {
				if (square_isplayer(c, grid)) {
					s = "@";
				} else if (square_isoccupied(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"M" : "*";
				} else if (square_isdoor(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"+" : "*";
				} else if (square_isrubble(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						":" : "*";
				} else if (square_isdownstairs(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"&gt;" : "*";
				} else if (square_isupstairs(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"&lt;" : "*";
				} else if (square_istrap(c, grid) ||
					square_isplayertrap(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"^" : "*";
				} else if (square_iswebbed(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"w" : "*";
				} else if (square_object(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"$" : "*";
				} else if (square_isempty(c, grid) &&
						(square_isvault(c, grid) ||
						square_isno_stairs(c, grid))) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						" " : "*";
				} else if (square_ispassable(c, grid)) {
					s = (dist == NULL || dist[y][x] >= 0) ?
						"." : "*";
				}
			}
			file_put(fo, s);
		}
		file_put(fo, "\n");
	}
	file_put(fo, "    </pre>\n");
}